

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryGLImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::QueryGLImpl::GetData(QueryGLImpl *this,void *pData,Uint32 DataSize,bool AutoInvalidate)

{
  PFNGLGETQUERYOBJECTUIVPROC p_Var1;
  PFNGLGETQUERYOBJECTUI64VPROC p_Var2;
  GLuint GVar3;
  Char *pCVar4;
  uint *Args_1;
  undefined1 local_170 [8];
  string msg_6;
  QueryDataDuration *QueryData_4;
  string msg_5;
  QueryDataTimestamp *QueryData_3;
  string msg_4;
  GLuint64 GStack_f8;
  GLenum err_4;
  GLuint64 Counter;
  string msg_3;
  GLenum err_3;
  GLuint PrimitivesGenerated;
  QueryDataPipelineStatistics *QueryData_2;
  string msg_2;
  GLenum err_2;
  GLuint AnySamplePassed;
  QueryDataBinaryOcclusion *QueryData_1;
  string msg_1;
  GLenum err_1;
  GLuint SamplesPassed;
  QueryDataOcclusion *QueryData;
  undefined1 local_50 [8];
  string msg;
  GLenum err;
  GLuint ResultAvailable;
  bool AutoInvalidate_local;
  Uint32 DataSize_local;
  void *pData_local;
  QueryGLImpl *this_local;
  
  QueryBase<Diligent::EngineGLImplTraits>::CheckQueryDataPtr
            (&this->super_QueryBase<Diligent::EngineGLImplTraits>,pData,DataSize);
  p_Var1 = __glewGetQueryObjectuiv;
  msg.field_2._12_4_ = 0;
  if ((this->super_QueryBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>.
      m_Desc.Type - QUERY_TYPE_OCCLUSION < 5) {
    GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                      ((GLObjWrapper *)
                       &(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44);
    (*p_Var1)(GVar3,0x8867,(GLuint *)(msg.field_2._M_local_buf + 0xc));
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[27],char[17],unsigned_int>
                (false,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                 ,0x4f,(char (*) [27])"Failed to get query result",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_50,(char (*) [6])0xe8e72e);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"GetData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                 ,0x4f);
      std::__cxx11::string::~string((string *)local_50);
    }
    p_Var2 = __glewGetQueryObjectui64v;
    p_Var1 = __glewGetQueryObjectuiv;
    if ((msg.field_2._12_4_ != 0) && (pData != (void *)0x0)) {
      Args_1 = &switchD_005102e3::switchdataD_00e692cc;
      switch((this->super_QueryBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
             .m_Desc.Type) {
      case QUERY_TYPE_OCCLUSION:
        msg_1.field_2._12_4_ = 0;
        GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                          ((GLObjWrapper *)
                           &(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44);
        (*p_Var1)(GVar3,0x8866,(GLuint *)(msg_1.field_2._M_local_buf + 0xc));
        msg_1.field_2._8_4_ = glGetError();
        if (msg_1.field_2._8_4_ != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x60,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 8));
          FormatString<char[6]>((string *)&QueryData_1,(char (*) [6])0xe8e72e);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x60);
          std::__cxx11::string::~string((string *)&QueryData_1);
        }
        *(ulong *)((long)pData + 8) = (ulong)(uint)msg_1.field_2._12_4_;
        break;
      case QUERY_TYPE_BINARY_OCCLUSION:
        msg_2.field_2._12_4_ = 0;
        GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                          ((GLObjWrapper *)
                           &(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44);
        (*p_Var1)(GVar3,0x8866,(GLuint *)(msg_2.field_2._M_local_buf + 0xc));
        msg_2.field_2._8_4_ = glGetError();
        if (msg_2.field_2._8_4_ != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x6b,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 8));
          FormatString<char[6]>((string *)&QueryData_2,(char (*) [6])0xe8e72e);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x6b);
          std::__cxx11::string::~string((string *)&QueryData_2);
        }
        *(bool *)((long)pData + 4) = msg_2.field_2._12_4_ != 0;
        break;
      case QUERY_TYPE_TIMESTAMP:
      case QUERY_TYPE_DURATION:
        if (__glewGetQueryObjectui64v != (PFNGLGETQUERYOBJECTUI64VPROC)0x0) {
          GStack_f8 = 0;
          GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                            ((GLObjWrapper *)
                             &(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44);
          (*p_Var2)(GVar3,0x8866,&stack0xffffffffffffff08);
          msg_4.field_2._12_4_ = glGetError();
          if (msg_4.field_2._12_4_ != 0) {
            LogError<false,char[27],char[17],unsigned_int>
                      (false,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x82,(char (*) [27])"Failed to get query result",
                       (char (*) [17])"\nGL Error Code: ",(uint *)(msg_4.field_2._M_local_buf + 0xc)
                      );
            FormatString<char[6]>((string *)&QueryData_3,(char (*) [6])0xe8e72e);
            pCVar4 = (Char *)std::__cxx11::string::c_str();
            Args_1 = (uint *)0x82;
            DebugAssertionFailed
                      (pCVar4,"GetData",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                       ,0x82);
            std::__cxx11::string::~string((string *)&QueryData_3);
          }
          if ((this->super_QueryBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
              .m_Desc.Type == QUERY_TYPE_TIMESTAMP) {
            *(GLuint64 *)((long)pData + 8) = GStack_f8;
            *(undefined8 *)((long)pData + 0x10) = 1000000000;
            msg_5.field_2._8_8_ = pData;
          }
          else {
            if ((this->super_QueryBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IQueryGL,_Diligent::RenderDeviceGLImpl,_Diligent::QueryDesc>
                .m_Desc.Type != QUERY_TYPE_DURATION) {
              FormatString<char[26],char[35]>
                        ((string *)&QueryData_4,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"m_Desc.Type == QUERY_TYPE_DURATION",(char (*) [35])Args_1);
              pCVar4 = (Char *)std::__cxx11::string::c_str();
              DebugAssertionFailed
                        (pCVar4,"GetData",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                         ,0x8c);
              std::__cxx11::string::~string((string *)&QueryData_4);
            }
            *(GLuint64 *)((long)pData + 8) = GStack_f8;
            *(undefined8 *)((long)pData + 0x10) = 1000000000;
            msg_6.field_2._8_8_ = pData;
          }
        }
        break;
      case QUERY_TYPE_PIPELINE_STATISTICS:
        msg_3.field_2._12_4_ = 0;
        GVar3 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                          ((GLObjWrapper *)
                           &(this->super_QueryBase<Diligent::EngineGLImplTraits>).field_0x44);
        (*p_Var1)(GVar3,0x8866,(GLuint *)(msg_3.field_2._M_local_buf + 0xc));
        msg_3.field_2._8_4_ = glGetError();
        if (msg_3.field_2._8_4_ != 0) {
          LogError<false,char[27],char[17],unsigned_int>
                    (false,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x76,(char (*) [27])"Failed to get query result",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_3.field_2._M_local_buf + 8));
          FormatString<char[6]>((string *)&Counter,(char (*) [6])0xe8e72e);
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"GetData",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                     ,0x76);
          std::__cxx11::string::~string((string *)&Counter);
        }
        *(ulong *)((long)pData + 0x20) = (ulong)(uint)msg_3.field_2._12_4_;
        break;
      default:
        FormatString<char[22]>((string *)local_170,(char (*) [22])"Unexpected query type");
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"GetData",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/QueryGLImpl.cpp"
                   ,0x97);
        std::__cxx11::string::~string((string *)local_170);
        return false;
      }
      if (AutoInvalidate) {
        QueryBase<Diligent::EngineGLImplTraits>::Invalidate
                  (&this->super_QueryBase<Diligent::EngineGLImplTraits>);
      }
    }
    this_local._7_1_ = msg.field_2._12_4_ != 0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool QueryGLImpl::GetData(void* pData, Uint32 DataSize, bool AutoInvalidate)
{
    TQueryBase::CheckQueryDataPtr(pData, DataSize);

    GLuint ResultAvailable = GL_FALSE;

    switch (m_Desc.Type)
    {
#if GL_SAMPLES_PASSED
        case QUERY_TYPE_OCCLUSION:
#endif

        case QUERY_TYPE_BINARY_OCCLUSION:

#if GL_PRIMITIVES_GENERATED
        case QUERY_TYPE_PIPELINE_STATISTICS:
#endif

        case QUERY_TYPE_DURATION:
        case QUERY_TYPE_TIMESTAMP:
            glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT_AVAILABLE, &ResultAvailable);
            DEV_CHECK_GL_ERROR("Failed to get query result");
            break;

        default:
            return false;
    }

    if (ResultAvailable && pData != nullptr)
    {
        switch (m_Desc.Type)
        {
            case QUERY_TYPE_OCCLUSION:
            {
                auto& QueryData = *reinterpret_cast<QueryDataOcclusion*>(pData);

                GLuint SamplesPassed = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &SamplesPassed);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.NumSamples = SamplesPassed;
            }
            break;

            case QUERY_TYPE_BINARY_OCCLUSION:
            {
                auto& QueryData = *reinterpret_cast<QueryDataBinaryOcclusion*>(pData);

                GLuint AnySamplePassed = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &AnySamplePassed);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.AnySamplePassed = AnySamplePassed != 0;
            }
            break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
            {
                auto& QueryData = *reinterpret_cast<QueryDataPipelineStatistics*>(pData);

                GLuint PrimitivesGenerated = 0;
                glGetQueryObjectuiv(m_GlQuery, GL_QUERY_RESULT, &PrimitivesGenerated);
                DEV_CHECK_GL_ERROR("Failed to get query result");
                QueryData.ClippingInvocations = PrimitivesGenerated;
            }
            break;

            case QUERY_TYPE_TIMESTAMP:
            case QUERY_TYPE_DURATION:
            {
                if (glGetQueryObjectui64v != nullptr)
                {
                    GLuint64 Counter = 0;
                    glGetQueryObjectui64v(m_GlQuery, GL_QUERY_RESULT, &Counter);
                    DEV_CHECK_GL_ERROR("Failed to get query result");
                    if (m_Desc.Type == QUERY_TYPE_TIMESTAMP)
                    {
                        auto& QueryData   = *reinterpret_cast<QueryDataTimestamp*>(pData);
                        QueryData.Counter = Counter;
                        // Counter is always measured in nanoseconds (10^-9 seconds)
                        QueryData.Frequency = 1000000000;
                    }
                    else
                    {
                        VERIFY_EXPR(m_Desc.Type == QUERY_TYPE_DURATION);
                        auto& QueryData    = *reinterpret_cast<QueryDataDuration*>(pData);
                        QueryData.Duration = Counter;
                        // Counter is always measured in nanoseconds (10^-9 seconds)
                        QueryData.Frequency = 1000000000;
                    }
                }
            }
            break;

            default:
                UNEXPECTED("Unexpected query type");
                return false;
        }

        if (AutoInvalidate)
        {
            Invalidate();
        }
    }

    return ResultAvailable != GL_FALSE;
}